

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_used_labels.cc
# Opt level: O2

void __thiscall
re2c::Linear::used_labels
          (Linear *this,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used)

{
  pointer ppVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppVar1 = (this->branches).
             super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->branches).
                      super__Vector_base<std::pair<const_re2c::Cond_*,_const_re2c::State_*>,_std::allocator<std::pair<const_re2c::Cond_*,_const_re2c::State_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) <=
        (ulong)uVar2) break;
    std::
    _Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
    ::_M_insert_unique<re2c::label_t_const&>
              ((_Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
                *)used,&(ppVar1[uVar2].second)->label);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void Linear::used_labels (std::set<label_t> & used)
{
	for (uint32_t i = 0; i < branches.size (); ++i)
	{
		used.insert (branches[i].second->label);
	}
}